

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_dalloc_bin(tsdn_t *tsdn,arena_t *arena,edata_t *edata,void *ptr)

{
  szind_t sVar1;
  uint uVar2;
  bin_t *pbVar3;
  void *pvVar4;
  size_t bit;
  slab_data_t *bitmap;
  bin_t *in_RCX;
  long lVar5;
  edata_t *in_RDX;
  uint dalloc_slabs_count;
  edata_t *dalloc_slabs [1];
  arena_dalloc_bin_locked_info_t info;
  bin_t *bin;
  uint binshard;
  szind_t binind;
  uint nfree;
  slab_data_t *slab_data;
  size_t regind;
  bin_info_t *bin_info;
  size_t regind_1;
  size_t regind_2;
  size_t diff;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int iVar6;
  uint in_stack_fffffffffffffeb8;
  szind_t in_stack_fffffffffffffebc;
  div_info_t dVar7;
  arena_t *in_stack_fffffffffffffec0;
  uint32_t uVar8;
  tsdn_t *in_stack_fffffffffffffec8;
  
  sVar1 = edata_szind_get((edata_t *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  edata_binshard_get(in_RDX);
  pbVar3 = arena_get_bin(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                         in_stack_fffffffffffffeb8);
  malloc_mutex_lock(in_stack_fffffffffffffec8,(malloc_mutex_t *)in_stack_fffffffffffffec0);
  dVar7.magic = duckdb_je_arena_binind_div_info[sVar1].magic;
  uVar8 = duckdb_je_bin_infos[sVar1].nregs;
  lVar5 = 0;
  iVar6 = 0;
  pvVar4 = edata_addr_get(in_RDX);
  bit = div_compute((div_info_t *)&stack0xfffffffffffffec0,(long)in_RCX - (long)pvVar4);
  bitmap = edata_slab_data_get(in_RDX);
  bitmap_unset(bitmap->bitmap,&duckdb_je_bin_infos[sVar1].bitmap_info,bit);
  edata_nfree_inc(in_RDX);
  lVar5 = lVar5 + 1;
  uVar2 = edata_nfree_get(in_RDX);
  if (uVar2 == duckdb_je_bin_infos[sVar1].nregs) {
    duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
              ((tsdn_t *)in_stack_fffffffffffffec0,
               (arena_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (edata_t *)CONCAT44(iVar6,in_stack_fffffffffffffeb0),in_RCX);
    if (iVar6 == 0) {
      iVar6 = 1;
    }
    else {
      edata_list_active_append((edata_list_active_t *)0x0,in_RDX);
    }
  }
  else if ((uVar2 == 1) && (in_RDX != pbVar3->slabcur)) {
    duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
              ((tsdn_t *)in_stack_fffffffffffffec0,
               (arena_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (edata_t *)CONCAT44(iVar6,in_stack_fffffffffffffeb0),in_RCX);
  }
  (pbVar3->stats).ndalloc = lVar5 + (pbVar3->stats).ndalloc;
  (pbVar3->stats).curregs = (pbVar3->stats).curregs - lVar5;
  malloc_mutex_unlock((tsdn_t *)in_stack_fffffffffffffec0,
                      (malloc_mutex_t *)
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (iVar6 != 0) {
    duckdb_je_arena_slab_dalloc
              ((tsdn_t *)in_stack_fffffffffffffec0,
               (arena_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (edata_t *)CONCAT44(iVar6,in_stack_fffffffffffffeb0));
  }
  return;
}

Assistant:

static void
arena_dalloc_bin(tsdn_t *tsdn, arena_t *arena, edata_t *edata, void *ptr) {
	szind_t binind = edata_szind_get(edata);
	unsigned binshard = edata_binshard_get(edata);
	bin_t *bin = arena_get_bin(arena, binind, binshard);

	malloc_mutex_lock(tsdn, &bin->lock);
	arena_dalloc_bin_locked_info_t info;
	arena_dalloc_bin_locked_begin(&info, binind);
	edata_t *dalloc_slabs[1];
	unsigned dalloc_slabs_count = 0;
	arena_dalloc_bin_locked_step(tsdn, arena, bin, &info, binind, edata,
	    ptr, dalloc_slabs, /* ndalloc_slabs */ 1, &dalloc_slabs_count,
	    /* dalloc_slabs_extra */ NULL);
	arena_dalloc_bin_locked_finish(tsdn, arena, bin, &info);
	malloc_mutex_unlock(tsdn, &bin->lock);

	if (dalloc_slabs_count != 0) {
		assert(dalloc_slabs[0] == edata);
		arena_slab_dalloc(tsdn, arena, edata);
	}
}